

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall
parser::Parser::Parser
          (Parser *this,Grammar *grammar,bool debug,TerminalNames *terminalNames,
          NonTerminalNames *nonTerminalNames)

{
  _Rb_tree_header *p_Var1;
  pointer *ppAVar2;
  _Rb_tree_header *p_Var3;
  pointer piVar4;
  pointer piVar5;
  long lVar6;
  pointer pSVar7;
  iterator iVar8;
  Convolution *pCVar9;
  bool bVar10;
  _Base_ptr p_Var11;
  _Base_ptr p_Var12;
  vector<parser::ActionState,_std::allocator<parser::ActionState>_> *this_00;
  vector<parser::ActionState,std::allocator<parser::ActionState>> *this_01;
  __normal_iterator<parser::ActionState_*,_std::vector<parser::ActionState,_std::allocator<parser::ActionState>_>_>
  _Var13;
  State *pSVar14;
  CanonicalItem *pCVar15;
  ostream *poVar16;
  undefined8 uVar17;
  CanonicalItem *pCVar18;
  undefined7 in_register_00000011;
  ulong uVar19;
  pointer pSVar20;
  ulong uVar21;
  State state;
  size_t sVar22;
  ulong uVar23;
  _Base_ptr p_Var24;
  _Base_ptr __v;
  pointer lhs;
  Convolution *pCVar25;
  CanonicalSet canonicalSet;
  Situations goToSits;
  ActionState actionState;
  UniqueTerminals uniqueTerminals;
  UniqueNonTerminals uniqueNonTerminals;
  UniqueGrammaticSymbols uniqueGrammaticSymbols;
  ulong local_170;
  CanonicalSet local_168;
  Grammar *local_150;
  ActionState local_148;
  ActionState local_130;
  long local_118;
  undefined4 local_10c;
  StateTable *local_108;
  NonTerminalNames *local_100;
  TerminalNames *local_f8;
  NonTerminalNames *local_f0;
  TerminalNames *local_e8;
  undefined1 local_e0 [8];
  _Rb_tree_node_base local_d8;
  size_t local_b8;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_b0;
  _Rb_tree<parser::GrammaticSymbol,_parser::GrammaticSymbol,_std::_Identity<parser::GrammaticSymbol>,_std::less<parser::GrammaticSymbol>,_std::allocator<parser::GrammaticSymbol>_>
  local_80;
  string local_50;
  
  local_108 = &this->goToTable;
  this->states = 0;
  this->terminals = 0;
  (this->goToTable).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->goToTable).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->actionTable).
  super__Vector_base<std::vector<parser::ActionState,_std::allocator<parser::ActionState>_>,_std::allocator<std::vector<parser::ActionState,_std::allocator<parser::ActionState>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->goToTable).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->actionTable).
  super__Vector_base<std::vector<parser::ActionState,_std::allocator<parser::ActionState>_>,_std::allocator<std::vector<parser::ActionState,_std::allocator<parser::ActionState>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->actionTable).
  super__Vector_base<std::vector<parser::ActionState,_std::allocator<parser::ActionState>_>,_std::allocator<std::vector<parser::ActionState,_std::allocator<parser::ActionState>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->nonTerminals = 0;
  local_10c = (undefined4)CONCAT71(in_register_00000011,debug);
  this->debug = debug;
  local_f8 = &this->terminalNames;
  local_150 = grammar;
  local_e8 = terminalNames;
  std::
  _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_f8->_M_t,&terminalNames->_M_t);
  local_100 = &this->nonTerminalNames;
  local_f0 = nonTerminalNames;
  std::
  _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_100->_M_t,&nonTerminalNames->_M_t);
  p_Var3 = &local_80._M_impl.super__Rb_tree_header;
  local_80._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_80._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_80._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var12 = (local_150->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(local_150->_M_t)._M_impl.super__Rb_tree_header;
  local_80._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  local_80._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  if ((_Rb_tree_header *)p_Var12 != p_Var1) {
    do {
      local_e0._0_4_ = p_Var12[1]._M_color;
      local_e0[4] = false;
      std::
      _Rb_tree<parser::GrammaticSymbol,_parser::GrammaticSymbol,_std::_Identity<parser::GrammaticSymbol>,_std::less<parser::GrammaticSymbol>,_std::allocator<parser::GrammaticSymbol>_>
      ::_M_insert_unique<parser::GrammaticSymbol>(&local_80,(GrammaticSymbol *)local_e0);
      p_Var11 = p_Var12[1]._M_left;
      for (p_Var24 = p_Var12[1]._M_parent; p_Var24 != p_Var11;
          p_Var24 = (_Base_ptr)&p_Var24->_M_right) {
        __v = *(_Base_ptr *)p_Var24;
        if (__v != p_Var24->_M_parent) {
          do {
            std::
            _Rb_tree<parser::GrammaticSymbol,parser::GrammaticSymbol,std::_Identity<parser::GrammaticSymbol>,std::less<parser::GrammaticSymbol>,std::allocator<parser::GrammaticSymbol>>
            ::_M_insert_unique<parser::GrammaticSymbol_const&>
                      ((_Rb_tree<parser::GrammaticSymbol,parser::GrammaticSymbol,std::_Identity<parser::GrammaticSymbol>,std::less<parser::GrammaticSymbol>,std::allocator<parser::GrammaticSymbol>>
                        *)&local_80,(GrammaticSymbol *)__v);
            __v = (_Base_ptr)&__v->_M_parent;
          } while (__v != p_Var24->_M_parent);
          p_Var11 = p_Var12[1]._M_left;
        }
      }
      p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
    } while ((_Rb_tree_header *)p_Var12 != p_Var1);
  }
  items(&local_168,this,local_150,(UniqueGrammaticSymbols *)&local_80);
  local_d8._M_left = &local_d8;
  local_d8._M_color = _S_red;
  local_d8._M_parent = (_Base_ptr)0x0;
  local_b8 = 0;
  local_d8._M_right = local_d8._M_left;
  if ((_Rb_tree_header *)local_80._M_impl.super__Rb_tree_header._M_header._M_left != p_Var3) {
    p_Var12 = local_80._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      if (p_Var12[1].field_0x4 == '\x01') {
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   local_e0,(int *)(p_Var12 + 1));
      }
      p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
    } while ((_Rb_tree_header *)p_Var12 != p_Var3);
  }
  local_b0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_b0._M_impl.super__Rb_tree_header._M_header;
  local_b0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_b0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_b0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_b0._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)local_80._M_impl.super__Rb_tree_header._M_header._M_left != p_Var3) {
    p_Var12 = local_80._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      if (p_Var12[1].field_0x4 == '\0') {
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   &local_b0,(int *)(p_Var12 + 1));
      }
      p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
    } while ((_Rb_tree_header *)p_Var12 != p_Var3);
  }
  sVar22 = (long)local_168.
                 super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)local_168.
                 super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 5;
  this->states = sVar22;
  this->terminals = local_b8;
  this->nonTerminals = local_b0._M_impl.super__Rb_tree_header._M_node_count;
  std::
  vector<std::vector<parser::ActionState,_std::allocator<parser::ActionState>_>,_std::allocator<std::vector<parser::ActionState,_std::allocator<parser::ActionState>_>_>_>
  ::resize(&this->actionTable,sVar22 * local_b8);
  std::vector<int,_std::allocator<int>_>::resize(local_108,this->nonTerminals * this->states);
  piVar4 = (this->goToTable).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar5 = (this->goToTable).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar4 != piVar5) {
    memset(piVar4,0xff,((long)piVar5 + (-4 - (long)piVar4) & 0xfffffffffffffffcU) + 4);
  }
  if (local_168.super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_168.super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    pCVar15 = local_168.
              super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pCVar18 = local_168.
              super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    uVar21 = 0;
    do {
      uVar23 = uVar21;
      if ((ulong)((long)pCVar18 - (long)pCVar15 >> 5) <= uVar23) {
LAB_00114687:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_00114695:
        uVar17 = std::__throw_out_of_range_fmt
                           ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                            ,local_170);
        std::
        _Rb_tree<parser::GrammaticSymbol,_parser::GrammaticSymbol,_std::_Identity<parser::GrammaticSymbol>,_std::less<parser::GrammaticSymbol>,_std::allocator<parser::GrammaticSymbol>_>
        ::~_Rb_tree(&local_80);
        std::
        _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&local_100->_M_t);
        std::
        _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&local_f8->_M_t);
        piVar4 = (local_108->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (piVar4 != (pointer)0x0) {
          operator_delete(piVar4,(long)(this->goToTable).
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_end_of_storage - (long)piVar4);
        }
        std::
        vector<std::vector<parser::ActionState,_std::allocator<parser::ActionState>_>,_std::allocator<std::vector<parser::ActionState,_std::allocator<parser::ActionState>_>_>_>
        ::~vector(&this->actionTable);
        _Unwind_Resume(uVar17);
      }
      local_118 = uVar23 * 0x20;
      pSVar20 = pCVar15[uVar23].situations.
                super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>._M_impl.
                super__Vector_impl_data._M_start;
      while( true ) {
        state = (State)uVar23;
        local_170 = uVar23;
        if (pSVar20 ==
            *(pointer *)
             ((long)&(pCVar15->situations).
                     super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>.
                     _M_impl.super__Vector_impl_data._M_finish + local_118)) break;
        p_Var12 = local_d8._M_left;
        if (local_d8._M_left != &local_d8) {
          do {
            lVar6 = *(long *)&(pSVar20->super_Convolution).body.
                              super__Vector_base<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>
                              ._M_impl;
            uVar19 = (long)*(pointer *)((long)&(pSVar20->super_Convolution).body + 8) - lVar6 >> 3;
            uVar21 = pSVar20->point;
            if (uVar19 == uVar21) {
              this_00 = getAction(this,state,p_Var12[1]._M_color);
              local_148.nonTerminal = (pSVar20->super_Convolution).header;
              if (local_148.nonTerminal == 0) {
                local_148.state = 0;
                local_148.action = Accept;
                local_148.reduceCount = 0;
              }
              else {
                local_148.reduceCount =
                     (long)*(pointer *)((long)&(pSVar20->super_Convolution).body + 8) -
                     *(long *)&(pSVar20->super_Convolution).body.
                               super__Vector_base<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>
                               ._M_impl >> 3;
                local_148.action = Reduce;
                local_148.state = state;
              }
              iVar8._M_current =
                   (this_00->
                   super__Vector_base<parser::ActionState,_std::allocator<parser::ActionState>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
              if (iVar8._M_current ==
                  (this_00->
                  super__Vector_base<parser::ActionState,_std::allocator<parser::ActionState>_>).
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<parser::ActionState,_std::allocator<parser::ActionState>_>::
                _M_realloc_insert<parser::ActionState>(this_00,iVar8,&local_148);
              }
              else {
                (iVar8._M_current)->reduceCount = local_148.reduceCount;
                (iVar8._M_current)->action = local_148.action;
                (iVar8._M_current)->state = local_148.state;
                *(ulong *)&(iVar8._M_current)->nonTerminal =
                     CONCAT44(local_148._12_4_,local_148.nonTerminal);
                ppAVar2 = &(this_00->
                           super__Vector_base<parser::ActionState,_std::allocator<parser::ActionState>_>
                           )._M_impl.super__Vector_impl_data._M_finish;
                *ppAVar2 = *ppAVar2 + 1;
              }
            }
            else {
              if (uVar19 <= uVar21) {
                std::__throw_out_of_range_fmt
                          (
                          "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                          );
LAB_00114674:
                std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,uVar23);
                goto LAB_00114687;
              }
              if (*(char *)(lVar6 + 4 + uVar21 * 8) == '\x01') {
                if ((ulong)((long)local_168.
                                  super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_168.
                                  super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar23)
                goto LAB_00114674;
                local_130.action = p_Var12[1]._M_color;
                local_130.state = CONCAT31(local_130.state._1_3_,1);
                goTo((Situations *)&local_148,this,local_150,
                     (Situations *)
                     ((long)&((local_168.
                               super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>
                               ._M_impl.super__Vector_impl_data._M_start)->situations).
                             super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>
                             ._M_impl.super__Vector_impl_data._M_start + local_118),
                     (GrammaticSymbol *)&local_130);
                if (local_168.
                    super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>
                    ._M_impl.super__Vector_impl_data._M_finish !=
                    local_168.
                    super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
                  uVar21 = 0;
                  do {
                    lhs = local_168.
                          super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar21].situations.
                          super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                    pSVar7 = local_168.
                             super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar21].situations.
                             super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                    pCVar25 = (Convolution *)CONCAT44(local_148.state,local_148.action);
                    if ((long)pSVar7 - (long)lhs ==
                        CONCAT44(local_148._12_4_,local_148.nonTerminal) - (long)pCVar25) {
                      for (; lhs != pSVar7; lhs = lhs + 1) {
                        bVar10 = operator==(&lhs->super_Convolution,pCVar25);
                        if (!bVar10 || (_func_int **)lhs->point != pCVar25[1]._vptr_Convolution)
                        goto LAB_001142e0;
                        pCVar25 = (Convolution *)&pCVar25[1].header;
                      }
                      local_130.action = _S_red;
                      local_130.state = (State)uVar21;
                      local_130.nonTerminal = 0;
                      local_130.reduceCount = 0;
                      this_01 = (vector<parser::ActionState,std::allocator<parser::ActionState>> *)
                                getAction(this,state,p_Var12[1]._M_color);
                      _Var13 = std::
                               __find_if<__gnu_cxx::__normal_iterator<parser::ActionState*,std::vector<parser::ActionState,std::allocator<parser::ActionState>>>,__gnu_cxx::__ops::_Iter_equals_val<parser::ActionState_const>>
                                         (*(undefined8 *)this_01,*(undefined8 *)(this_01 + 8),
                                          &local_130);
                      iVar8._M_current = *(ActionState **)(this_01 + 8);
                      if (_Var13._M_current == iVar8._M_current) {
                        if (_Var13._M_current == *(ActionState **)(this_01 + 0x10)) {
                          std::vector<parser::ActionState,std::allocator<parser::ActionState>>::
                          _M_realloc_insert<parser::ActionState_const&>(this_01,iVar8,&local_130);
                        }
                        else {
                          (iVar8._M_current)->reduceCount = local_130.reduceCount;
                          (iVar8._M_current)->action = local_130.action;
                          (iVar8._M_current)->state = local_130.state;
                          *(ulong *)&(iVar8._M_current)->nonTerminal =
                               CONCAT44(local_130._12_4_,local_130.nonTerminal);
                          *(long *)(this_01 + 8) = *(long *)(this_01 + 8) + 0x18;
                        }
                      }
                    }
LAB_001142e0:
                    uVar21 = uVar21 + 1;
                  } while (uVar21 < (ulong)((long)local_168.
                                                  super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)local_168.
                                                  super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 5));
                }
                std::vector<parser::Situation,_std::allocator<parser::Situation>_>::~vector
                          ((vector<parser::Situation,_std::allocator<parser::Situation>_> *)
                           &local_148);
              }
            }
            p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
            pCVar15 = local_168.
                      super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pCVar18 = local_168.
                      super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          } while (p_Var12 != &local_d8);
        }
        pSVar20 = pSVar20 + 1;
        if ((ulong)((long)pCVar18 - (long)pCVar15 >> 5) <= uVar23) goto LAB_00114687;
      }
      p_Var12 = local_b0._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((_Rb_tree_header *)local_b0._M_impl.super__Rb_tree_header._M_header._M_left !=
          &local_b0._M_impl.super__Rb_tree_header) {
        do {
          if ((ulong)((long)local_168.
                            super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_168.
                            super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar23)
          goto LAB_00114695;
          local_130.action = p_Var12[1]._M_color;
          local_130.state = local_130.state & 0xffffff00;
          goTo((Situations *)&local_148,this,local_150,
               (Situations *)
               ((long)&((local_168.
                         super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>
                         ._M_impl.super__Vector_impl_data._M_start)->situations).
                       super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>.
                       _M_impl.super__Vector_impl_data._M_start + local_118),
               (GrammaticSymbol *)&local_130);
          if (local_168.
              super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>.
              _M_impl.super__Vector_impl_data._M_finish !=
              local_168.
              super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>.
              _M_impl.super__Vector_impl_data._M_start) {
            uVar21 = 0;
            do {
              pCVar25 = (Convolution *)CONCAT44(local_148.state,local_148.action);
              pCVar9 = (Convolution *)CONCAT44(local_148._12_4_,local_148.nonTerminal);
              pSVar20 = local_168.
                        super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar21].situations.
                        super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              if ((long)pCVar9 - (long)pCVar25 ==
                  (long)local_168.
                        super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar21].situations.
                        super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)pSVar20) {
                for (; pCVar25 != pCVar9; pCVar25 = (Convolution *)&pCVar25[1].header) {
                  bVar10 = operator==(pCVar25,&pSVar20->super_Convolution);
                  if (!bVar10 || pCVar25[1]._vptr_Convolution != (_func_int **)pSVar20->point)
                  goto LAB_00114478;
                  pSVar20 = pSVar20 + 1;
                }
                pSVar14 = getGoTo(this,state,p_Var12[1]._M_color);
                *pSVar14 = (State)uVar21;
              }
LAB_00114478:
              uVar21 = uVar21 + 1;
            } while (uVar21 < (ulong)((long)local_168.
                                            super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_168.
                                            super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 5));
          }
          std::vector<parser::Situation,_std::allocator<parser::Situation>_>::~vector
                    ((vector<parser::Situation,_std::allocator<parser::Situation>_> *)&local_148);
          p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
          pCVar15 = local_168.
                    super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pCVar18 = local_168.
                    super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        } while ((_Rb_tree_header *)p_Var12 != &local_b0._M_impl.super__Rb_tree_header);
      }
      uVar21 = uVar23 + 1;
    } while (uVar23 + 1 < (ulong)((long)pCVar18 - (long)pCVar15 >> 5));
  }
  if ((char)local_10c != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"records in canonical set ",0x19);
    poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
    std::ostream::put((char)poVar16);
    std::ostream::flush();
    if (local_168.super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_168.super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      do {
        poVar16 = CanonicalItem::stringify
                            (local_168.
                             super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>
                             ._M_impl.super__Vector_impl_data._M_start,(ostream *)&std::cout,
                             local_e8,local_f0);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
        std::ostream::put((char)poVar16);
        std::ostream::flush();
        local_168.super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>.
        _M_impl.super__Vector_impl_data._M_start =
             local_168.
             super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>.
             _M_impl.super__Vector_impl_data._M_start + 1;
      } while (local_168.
               super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>.
               _M_impl.super__Vector_impl_data._M_start !=
               local_168.
               super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
    poVar16 = dotStringify(this,(ostream *)&std::cout,local_150,&local_168);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
    std::ostream::put((char)poVar16);
    std::ostream::flush();
    stringifyTables_abi_cxx11_(&local_50,this);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_b0);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_e0);
  std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>::~vector(&local_168);
  std::
  _Rb_tree<parser::GrammaticSymbol,_parser::GrammaticSymbol,_std::_Identity<parser::GrammaticSymbol>,_std::less<parser::GrammaticSymbol>,_std::allocator<parser::GrammaticSymbol>_>
  ::~_Rb_tree(&local_80);
  return;
}

Assistant:

explicit Parser(Grammar const& grammar = Grammar(),
                        bool debug = false,
                        lexer::TerminalNames const& terminalNames = lexer::TerminalNames(),
                        NonTerminalNames const& nonTerminalNames = NonTerminalNames()) :
                states(0), terminals(0), nonTerminals(0), debug(debug), terminalNames(terminalNames),
                nonTerminalNames(nonTerminalNames) {
            UniqueGrammaticSymbols uniqueGrammaticSymbols;
            for_each_c(Grammar, grammar, rule)
            {
                uniqueGrammaticSymbols.insert(GrammaticSymbol(rule->first, false));
                for_each_c(Alternative, rule->second, variants)
                    for_each_c(GrammaticSymbols, (*variants), item)
                        uniqueGrammaticSymbols.insert(*item);
            }

            CanonicalSet canonicalSet = items(grammar, uniqueGrammaticSymbols);

            UniqueTerminals uniqueTerminals;
            for_each(UniqueGrammaticSymbols, uniqueGrammaticSymbols, symbol)
                if (symbol->isTerminal)
                    uniqueTerminals.insert(symbol->value);
            UniqueNonTerminals uniqueNonTerminals;
            for_each(UniqueGrammaticSymbols, uniqueGrammaticSymbols, symbol)
                if (!symbol->isTerminal)
                    uniqueNonTerminals.insert(symbol->value);

            states = canonicalSet.size();
            terminals = uniqueTerminals.size();
            nonTerminals = uniqueNonTerminals.size();

            actionTable.resize(states * terminals);
            goToTable.resize(states * nonTerminals);
            for_each(StateTable, goToTable, gt) *gt = -1;

            for (size_t i = 0; i < canonicalSet.size(); ++i) {
                for_each_c(Situations, canonicalSet.at(i).situations, situation) {
                    for_each(UniqueTerminals, uniqueTerminals, terminal) {
                        if (situation->body.size() == situation->point) {
                            getAction(i, *terminal).push_back(
                                    situation->header == StartNonTerminal ? ActionState(Accept, 0, 0, 0)
                                                                          : ActionState(Reduce, i, situation->header, situation->body.size()));
                        } else {
                            if (!situation->body.at(situation->point).isTerminal)
                                continue;

                            Situations goToSits = goTo(grammar, canonicalSet.at(i).situations, GrammaticSymbol(*terminal));

                            for (size_t j = 0; j < canonicalSet.size(); ++j) {
                                if (canonicalSet.at(j).situations == goToSits) {
                                    ActionState actionState(Shift, j, 0, 0);
                                    std::vector<ActionState>& actions = getAction(i, *terminal);
                                    if (std::find(actions.begin(), actions.end(), actionState) == actions.end()) {
                                        actions.push_back(actionState);
                                    }
                                }
                            }
                        }
                    }
                }
                for_each(UniqueNonTerminals, uniqueNonTerminals, nonTerminal) {
                    Situations gts = goTo(grammar, canonicalSet.at(i).situations, GrammaticSymbol(*nonTerminal, false));
                    for (State j = 0; j < canonicalSet.size(); ++j) {
                        if (gts == canonicalSet.at(j).situations) {
                            getGoTo(i, *nonTerminal) = j;
                        }
                    }
                }
            }

            if (debug) {
                std::cout << "records in canonical set " << canonicalSet.size() << std::endl;
                for_each(CanonicalSet, canonicalSet, item)
                    item->stringify(std::cout, terminalNames, nonTerminalNames) << std::endl;
                dotStringify(std::cout, grammar, canonicalSet) << std::endl;
                stringifyTables();
            }
        }